

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O1

bool Cipher::saveFreqMapBinary(char *fname,TFreqMap *freqMap)

{
  TProb *pTVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  mapped_type_conflict *pmVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  uint8_t n_1;
  uint8_t d;
  vector<int,_std::allocator<int>_> keys;
  int32_t n;
  ofstream fout;
  char local_28a;
  char local_289;
  void *local_288;
  iterator iStack_280;
  int *local_278;
  int local_268;
  int local_264;
  _Rb_tree<int,_std::pair<const_int,_float>,_std::_Select1st<std::pair<const_int,_float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
  local_260;
  long local_230;
  filebuf local_228 [24];
  int aiStack_210 [54];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,fname,_S_bin);
  iVar5 = *(int *)((long)aiStack_210 + *(long *)(local_230 + -0x18));
  if (iVar5 == 0) {
    std::ostream::write((char *)&local_230,(long)freqMap);
    std::ostream::write((char *)&local_230,(long)&freqMap->nTotal);
    pTVar1 = &freqMap->pmin;
    std::ostream::write((char *)&local_230,(long)pTVar1);
    local_260._M_impl._0_4_ = *(undefined4 *)&(freqMap->prob)._M_h._M_element_count;
    std::ostream::write((char *)&local_230,(long)&local_260);
    local_268 = iVar5;
    std::map<int,float,std::less<int>,std::allocator<std::pair<int_const,float>>>::
    map<std::__detail::_Node_const_iterator<std::pair<int_const,float>,false,false>>
              ((map<int,float,std::less<int>,std::allocator<std::pair<int_const,float>>> *)
               &local_260,
               (_Node_const_iterator<std::pair<const_int,_float>,_false,_false>)
               (freqMap->prob)._M_h._M_before_begin._M_nxt,
               (_Node_const_iterator<std::pair<const_int,_float>,_false,_false>)0x0);
    local_288 = (void *)0x0;
    iStack_280._M_current = (int *)0x0;
    local_278 = (int *)0x0;
    p_Var2 = &local_260._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_260._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
      p_Var3 = local_260._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        if ((*(float *)&p_Var3[1].field_0x4 != *pTVar1) ||
           (NAN(*(float *)&p_Var3[1].field_0x4) || NAN(*pTVar1))) {
          if (iStack_280._M_current == local_278) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_288,iStack_280,(int *)(p_Var3 + 1))
            ;
          }
          else {
            *iStack_280._M_current = p_Var3[1]._M_color;
            iStack_280._M_current = iStack_280._M_current + 1;
          }
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var2);
    }
    if (0 < (int)((ulong)((long)iStack_280._M_current - (long)local_288) >> 2)) {
      lVar9 = 0;
      do {
        uVar7 = (uint)lVar9;
        std::ostream::write((char *)&local_230,(long)((long)local_288 + (long)(int)uVar7 * 4));
        pmVar4 = std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                 ::operator[]((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                               *)&local_260,
                              (key_type_conflict *)((long)(int)uVar7 * 4 + (long)local_288));
        std::ostream::write((char *)&local_230,(long)pmVar4);
        iVar5 = (int)((ulong)((long)iStack_280._M_current - (long)local_288) >> 2);
        if (uVar7 == iVar5 - 1U) break;
        local_264 = uVar7 + 1;
        lVar10 = (long)local_264;
        iVar5 = (iVar5 - uVar7) + -2;
        lVar6 = lVar10;
        while (lVar9 = lVar6,
              *(int *)((long)local_288 + lVar6 * 4) - *(int *)((long)local_288 + lVar6 * 4 + -4) <
              0x100) {
          lVar9 = lVar6 + 1;
          bVar11 = iVar5 == 0;
          iVar5 = iVar5 + -1;
          if ((bVar11) || (bVar11 = (int)(uVar7 + 0xfe) == lVar6, lVar6 = lVar9, bVar11)) break;
        }
        iVar8 = (int)lVar9;
        iVar5 = ~uVar7 + iVar8;
        local_28a = (char)iVar5;
        std::ostream::write((char *)&local_230,(long)&local_28a);
        if ((local_28a != '\0') && (local_264 < iVar8)) {
          lVar10 = lVar10 << 2;
          do {
            local_289 = (char)*(undefined4 *)((long)local_288 + lVar10) -
                        (char)*(undefined4 *)((long)local_288 + lVar10 + -4);
            std::ostream::write((char *)&local_230,(long)&local_289);
            pmVar4 = std::
                     map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                     ::operator[]((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                   *)&local_260,(key_type_conflict *)((long)local_288 + lVar10));
            std::ostream::write((char *)&local_230,(long)pmVar4);
            lVar10 = lVar10 + 4;
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
      } while (iVar8 < (int)((ulong)((long)iStack_280._M_current - (long)local_288) >> 2));
    }
    if (local_288 != (void *)0x0) {
      operator_delete(local_288,(long)local_278 - (long)local_288);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_float>,_std::_Select1st<std::pair<const_int,_float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
    ::~_Rb_tree(&local_260);
    iVar5 = local_268;
  }
  else {
    printf("    Failed to open file \'%s\'\n",fname);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return iVar5 == 0;
}

Assistant:

bool saveFreqMapBinary(const char * fname, const TFreqMap & freqMap) {
        std::ofstream fout(fname, std::ios::binary);
        if (fout.good() == false) {
            printf("    Failed to open file '%s'\n", fname);
            return false;
        }

        fout.write((const char *) &freqMap.len,    sizeof(freqMap.len));
        fout.write((const char *) &freqMap.nTotal, sizeof(freqMap.nTotal));
        fout.write((const char *) &freqMap.pmin,   sizeof(freqMap.pmin));

        { int32_t n = freqMap.prob.size(); fout.write((const char *) &n, sizeof(n)); }

        {
            std::map<TCode, TProb> sorted(freqMap.prob.begin(), freqMap.prob.end());

            std::vector<TCode> keys;
            for (const auto & [i, p] : sorted) {
                if (p == freqMap.pmin) {
                    continue;
                }
                keys.push_back(i);
            }

            int32_t is = 0;
            while (is < (int) keys.size()) {
                fout.write((const char *) &keys[is],         sizeof(keys[is]));
                fout.write((const char *) &sorted[keys[is]], sizeof(sorted[keys[is]]));

                if (is == (int) keys.size() - 1) break;

                int32_t ie = is + 1;
                while (keys[ie] - keys[ie - 1] < 256) {
                    ++ie;
                    if (ie == (int) keys.size()) break;
                    if (ie == is + 255) break;
                }

                uint8_t n = (uint8_t) (ie - is - 1);
                fout.write((const char *) &n, sizeof(n));
                if (n > 0) {
                    for (int i = is + 1; i < ie; ++i) {
                        uint8_t d = (uint8_t) (keys[i] - keys[i - 1]);
                        fout.write((const char *) &d,               sizeof(d));
                        fout.write((const char *) &sorted[keys[i]], sizeof(sorted[keys[i]]));
                    }
                }

                is = ie;
            }
        }

        return true;
    }